

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O3

void __thiscall FRandom::GenRandArray(FRandom *this,w128_t *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  QWORD QVar7;
  QWORD QVar8;
  undefined8 uVar9;
  long lVar10;
  QWORD QVar11;
  uint uVar12;
  w128_t *pwVar13;
  w128_t *pwVar14;
  w128_t *pwVar15;
  QWORD *pQVar16;
  long lVar17;
  w128_t *pwVar18;
  w128_t *pwVar19;
  ulong uVar20;
  
  lVar17 = 0xc;
  pwVar15 = (w128_t *)((this->sfmt).u64 + 6);
  pwVar18 = (w128_t *)((this->sfmt).u + 0x10);
  pwVar14 = array;
  do {
    pwVar19 = pwVar14;
    pwVar13 = pwVar18;
    uVar12 = pwVar15->u[3];
    QVar11 = pwVar15->u64[1];
    QVar8 = pwVar15->u64[1];
    QVar7 = pwVar15->u64[0];
    uVar3 = *(uint *)((long)&this->sfmt + lVar17);
    uVar4 = *(uint *)(&this->field_0x14 + lVar17);
    uVar5 = *(uint *)((long)&this->Next + lVar17 + 4);
    uVar6 = *(uint *)((long)&this->NameCRC + lVar17);
    pwVar19->u[0] =
         pwVar13->u[0] << 0xf ^ (uint)(QVar7 >> 0x18) ^
         (*(uint *)((long)&this->sfmt + lVar17 + 0x14) >> 0xd & 0x737ff | uVar5 << 0x18) ^ uVar5;
    pwVar19->u[1] =
         ((uint)(byte)(QVar7 >> 0x38) | (uint)(((ulong)(uint)QVar11 << 0x28) >> 0x20)) ^
         ((uint)(((ulong)uVar6 << 0x38) >> 0x20) | uVar5 >> 8) ^
         *(uint *)((long)&this->NameCRC + lVar17) ^
         pwVar13->u[1] << 0xf ^ *(uint *)((long)&this->sfmt + lVar17 + 0x18) >> 0xd & 0x73f7d;
    pwVar19->u[2] =
         (uint)(QVar8 >> 0x18) ^ (uVar4 << 0x18 | uVar6 >> 8) ^
         *(uint *)(&this->field_0x14 + lVar17) ^
         pwVar13->u[2] << 0xf ^ *(uint *)((long)&this->sfmt + lVar17 + 0x1c) >> 0xd & 0x77b7d;
    pwVar19->u[3] =
         uVar12 >> 0x18 ^ ((uint)(((ulong)uVar3 << 0x38) >> 0x20) | uVar4 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar17) ^
         pwVar13->u[3] << 0xf ^ *(uint *)((long)&this->sfmt + lVar17 + 0x20) >> 0xd & 0x7fb2f;
    lVar17 = lVar17 + 0x10;
    pwVar15 = pwVar13;
    pwVar18 = pwVar19;
    pwVar14 = pwVar19 + 1;
  } while (lVar17 != 0x3c);
  lVar17 = 0;
  do {
    pwVar15 = pwVar19;
    uVar12 = pwVar13->u[3];
    QVar11 = pwVar13->u64[1];
    QVar8 = pwVar13->u64[1];
    QVar7 = pwVar13->u64[0];
    uVar3 = *(uint *)((long)&this->sfmt + lVar17 + 0x3c);
    uVar4 = *(uint *)((long)&this->sfmt + lVar17 + 0x38);
    uVar5 = *(uint *)((long)&this->sfmt + lVar17 + 0x30);
    uVar6 = *(uint *)((long)&this->sfmt + lVar17 + 0x34);
    *(DWORD *)((long)array + lVar17 + 0x30) =
         pwVar15->u[0] << 0xf ^ (uint)(QVar7 >> 0x18) ^
         (*(uint *)((long)array + lVar17) >> 0xd & 0x737ff | uVar5 << 0x18) ^ uVar5;
    *(uint *)((long)array + lVar17 + 0x34) =
         ((uint)(byte)(QVar7 >> 0x38) | (uint)(((ulong)(uint)QVar11 << 0x28) >> 0x20)) ^
         ((uint)(((ulong)uVar6 << 0x38) >> 0x20) | uVar5 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar17 + 0x34) ^
         pwVar15->u[1] << 0xf ^ *(uint *)((long)array + lVar17 + 4) >> 0xd & 0x73f7d;
    *(uint *)((long)array + lVar17 + 0x38) =
         (uint)(QVar8 >> 0x18) ^ (uVar4 << 0x18 | uVar6 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar17 + 0x38) ^
         pwVar15->u[2] << 0xf ^ *(uint *)((long)array + lVar17 + 8) >> 0xd & 0x77b7d;
    *(uint *)((long)array + lVar17 + 0x3c) =
         uVar12 >> 0x18 ^ ((uint)(((ulong)uVar3 << 0x38) >> 0x20) | uVar4 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar17 + 0x3c) ^
         pwVar15->u[3] << 0xf ^ *(uint *)((long)array + lVar17 + 0xc) >> 0xd & 0x7fb2f;
    lVar10 = lVar17 + 0x30;
    lVar17 = lVar17 + 0x10;
    pwVar13 = pwVar15;
    pwVar19 = (w128_t *)((long)array + lVar10);
  } while (lVar17 != 0x20);
  pwVar18 = array + 4;
  uVar12 = 5;
  if (10 < size) {
    uVar12 = size - 5;
    lVar17 = (ulong)uVar12 - 5;
    pwVar14 = pwVar15;
    pwVar18 = array + 4;
    do {
      pwVar15 = pwVar18;
      uVar3 = pwVar14->u[3];
      QVar11 = pwVar14->u64[1];
      QVar8 = pwVar14->u64[1];
      QVar7 = pwVar14->u64[0];
      uVar4 = pwVar15[-4].u[0];
      uVar5 = *(uint *)((long)pwVar15 + -0x3c);
      uVar6 = *(uint *)((long)pwVar15 + -0x38);
      pwVar15[1].u[0] =
           pwVar15->u[0] << 0xf ^ (uint)(QVar7 >> 0x18) ^
           (pwVar15[-2].u[0] >> 0xd & 0x737ff | uVar4 << 0x18) ^ uVar4;
      *(DWORD *)((long)pwVar15 + 0x14) =
           pwVar15->u[1] << 0xf ^ *(uint *)((long)pwVar15 + -0x1c) >> 0xd & 0x73f7d ^ uVar5 ^
           ((uint)(byte)(QVar7 >> 0x38) | (uint)(((ulong)(uint)QVar11 << 0x28) >> 0x20)) ^
           ((uint)(((ulong)uVar5 << 0x38) >> 0x20) | uVar4 >> 8);
      *(DWORD *)((long)pwVar15 + 0x18) =
           pwVar15->u[2] << 0xf ^ uVar6 ^
           (uint)(QVar8 >> 0x18) ^
           *(uint *)((long)pwVar15 + -0x18) >> 0xd & 0x77b7d ^ (uVar6 << 0x18 | uVar5 >> 8);
      *(DWORD *)((long)pwVar15 + 0x1c) =
           pwVar15->u[3] << 0xf ^ *(uint *)((long)pwVar15 + -0x34) ^
           *(uint *)((long)pwVar15 + -0x14) >> 0xd & 0x7fb2f ^ uVar3 >> 0x18 ^
           ((uint)(((ulong)*(uint *)((long)pwVar15 + -0x34) << 0x38) >> 0x20) | uVar6 >> 8);
      pwVar18 = pwVar15 + 1;
      lVar17 = lVar17 + -1;
      pwVar14 = pwVar15;
    } while (lVar17 != 0);
  }
  if (size < 10) {
    uVar20 = 1;
    if (1 < (int)(10U - size)) {
      uVar20 = (ulong)(10U - size);
    }
    lVar17 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar17 + (long)size * 0x10 + -0x50);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&this->sfmt + lVar17);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      lVar17 = lVar17 + 0x10;
    } while (uVar20 << 4 != lVar17);
  }
  else {
    uVar20 = 0;
  }
  if ((int)uVar12 < size) {
    lVar17 = (ulong)(uint)size - (ulong)uVar12;
    pQVar16 = (QWORD *)((long)&this->sfmt + uVar20 * 0x10);
    pwVar14 = array + uVar12;
    do {
      pwVar13 = pwVar14;
      uVar12 = pwVar15->u[3];
      QVar11 = pwVar15->u64[1];
      QVar8 = pwVar15->u64[1];
      QVar7 = pwVar15->u64[0];
      uVar3 = pwVar13[-5].u[0];
      uVar4 = *(uint *)((long)pwVar13 + -0x4c);
      uVar5 = *(uint *)((long)pwVar13 + -0x48);
      pwVar13->u[0] =
           pwVar18->u[0] << 0xf ^ (uint)(QVar7 >> 0x18) ^
           (pwVar13[-3].u[0] >> 0xd & 0x737ff | uVar3 << 0x18) ^ uVar3;
      pwVar13->u[1] =
           pwVar18->u[1] << 0xf ^ *(uint *)((long)pwVar13 + -0x2c) >> 0xd & 0x73f7d ^ uVar4 ^
           ((uint)(byte)(QVar7 >> 0x38) | (uint)(((ulong)(uint)QVar11 << 0x28) >> 0x20)) ^
           ((uint)(((ulong)uVar4 << 0x38) >> 0x20) | uVar3 >> 8);
      pwVar13->u[2] =
           pwVar18->u[2] << 0xf ^ uVar5 ^
           (uint)(QVar8 >> 0x18) ^
           *(uint *)((long)pwVar13 + -0x28) >> 0xd & 0x77b7d ^ (uVar5 << 0x18 | uVar4 >> 8);
      pwVar13->u[3] =
           pwVar18->u[3] << 0xf ^ *(uint *)((long)pwVar13 + -0x44) ^
           *(uint *)((long)pwVar13 + -0x24) >> 0xd & 0x7fb2f ^ uVar12 >> 0x18 ^
           ((uint)(((ulong)*(uint *)((long)pwVar13 + -0x44) << 0x38) >> 0x20) | uVar5 >> 8);
      QVar7 = pwVar13->u64[1];
      *pQVar16 = pwVar13->u64[0];
      pQVar16[1] = QVar7;
      pQVar16 = pQVar16 + 2;
      lVar17 = lVar17 + -1;
      pwVar15 = pwVar18;
      pwVar14 = pwVar13 + 1;
      pwVar18 = pwVar13;
    } while (lVar17 != 0);
  }
  return;
}

Assistant:

void FRandom::GenRandArray(w128_t *array, int size)
{
	int i, j;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < size - SFMT::N; i++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (j = 0; j < 2 * SFMT::N - size; j++) {
		sfmt.w128[j] = array[j + size - SFMT::N];
	}
	for (; i < size; i++, j++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
		sfmt.w128[j] = array[i];
	}
}